

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfrobjs.c
# Opt level: O0

void pfr_slot_done(FT_GlyphSlot_conflict pfrslot)

{
  PFR_Slot slot;
  FT_GlyphSlot_conflict pfrslot_local;
  
  pfr_glyph_done((PFR_Glyph)(pfrslot + 1));
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  pfr_slot_done( FT_GlyphSlot  pfrslot )        /* PFR_Slot */
  {
    PFR_Slot  slot = (PFR_Slot)pfrslot;


    pfr_glyph_done( &slot->glyph );
  }